

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  int scale;
  Platform platform;
  string rom;
  string local_3ac8;
  Chip8 chip8;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Enter ROM file path: ");
  std::endl<char,std::char_traits<char>>(poVar2);
  rom._M_dataplus._M_p = (pointer)&rom.field_2;
  rom._M_string_length = 0;
  rom.field_2._M_local_buf[0] = '\0';
  std::operator>>((istream *)&std::cin,(string *)&rom);
  poVar2 = std::operator<<((ostream *)&std::cout,"Enter scale: ");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::istream::operator>>((istream *)&std::cin,&scale);
  Platform::Platform(&platform,"CHIP8 Interpreter",scale << 6,scale << 5,0x40,0x20);
  Chip8::Chip8(&chip8);
  std::__cxx11::string::string((string *)&local_3ac8,&rom);
  Chip8::LoadGame(&chip8,&local_3ac8);
  std::__cxx11::string::~string((string *)&local_3ac8);
  do {
    bVar1 = Platform::ProcessInput(&platform,chip8.keys);
    Chip8::emulate(&chip8);
    Platform::Update(&platform,chip8.display,0x100);
  } while (!bVar1);
  Platform::~Platform(&platform);
  std::__cxx11::string::~string((string *)&rom);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    const unsigned int VIDEO_HEIGHT = 32;
    const unsigned int VIDEO_WIDTH = 64;

    std::cout << "Enter ROM file path: " << std::endl;
    std::string rom;
	std::cin >> rom;

    int scale;
    std::cout << "Enter scale: " << std::endl;
    std::cin >> scale;



	Platform platform("CHIP8 Interpreter", VIDEO_WIDTH * scale, VIDEO_HEIGHT * scale, VIDEO_WIDTH, VIDEO_HEIGHT);

	Chip8 chip8;
	chip8.LoadGame(rom);

	int videoPitch = sizeof(chip8.display[0]) * VIDEO_WIDTH;

	bool quit = false;

	while (!quit)
	{
		quit = platform.ProcessInput(chip8.keys);

			chip8.emulate();
			platform.Update(chip8.display, videoPitch);

	}

	return 0;
}